

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

quat quat_create_from_axis_angle(vec3 axis,float angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  quat qVar8;
  undefined8 local_38;
  
  fVar4 = axis.z;
  fVar2 = axis.x;
  fVar3 = axis.y;
  fVar1 = fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar5 = 0.0;
  fVar6 = 0.0;
  fVar7 = 0.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar6 = fVar2 / fVar1;
    fVar7 = fVar3 / fVar1;
    fVar5 = fVar4 / fVar1;
  }
  fVar2 = sinf(angle * 0.5);
  qVar8.z = fVar5 * fVar2;
  fVar1 = cosf(angle * 0.5);
  qVar8.w = fVar1;
  qVar8.x = fVar2 * fVar6;
  qVar8.y = fVar7 * fVar2;
  return qVar8;
}

Assistant:

quat quat_create_from_axis_angle(vec3 axis, float angle) {
    axis = vec3_normalize(axis);
    float temp = sinf(angle / 2.0f);
    float x = temp * axis.x;
    float y = temp * axis.y;
    float z = temp * axis.z;
    float w = cosf(angle / 2.0f);
    return quat_create(x, y, z, w);
}